

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

void big_file_set_error_message(char *msg)

{
  char *__ptr;
  char *__dest;
  size_t __n;
  
  if (msg == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __n = 0;
    do {
      if (msg[__n] == '\0') goto LAB_0010275f;
      __n = __n + 1;
    } while (__n != 0x2000);
    __n = 0x2000;
LAB_0010275f:
    __dest = (char *)malloc(__n + 1);
    strncpy(__dest,msg,__n);
    __dest[__n] = '\0';
  }
  __ptr = ERRORSTR;
  LOCK();
  ERRORSTR = __dest;
  UNLOCK();
  if (__ptr != (char *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void
big_file_set_error_message(char * msg)
{
    char * errorstr;
    if(msg != NULL) msg = _strdup(msg);

#if __STDC_VERSION__ >= 201112L && !defined(__STDC_NO_ATOMICS__)
    errorstr = atomic_exchange(&ERRORSTR, msg);
#elif defined(__ATOMIC_SEQ_CST)
    errorstr = __atomic_exchange_n(&ERRORSTR, msg, __ATOMIC_SEQ_CST);
#elif _OPENMP >= 201307
    /* openmp 4.0 supports swap capture*/
    #pragma omp capture 
     { errorstr = ERRORSTR; ERRORSTR = msg; }
#else
    errorstr = ERRORSTR;
    ERRORSTR = msg;
    /* really should have propagated errors over the stack! */
    #warning "enable -std=c11 or -std=gnu11, or luse gcc for thread friendly error handling"
#endif

    if(errorstr) free(errorstr);
}